

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_CorruptedDescriptor::_Run(_Test_CorruptedDescriptor *this)

{
  DB *pDVar1;
  DBImpl *this_00;
  bool bVar2;
  Tester local_738;
  Slice local_598;
  ReadOptions local_588;
  Status local_570;
  Tester local_568;
  string local_3c8 [8];
  string v;
  Tester local_3a8;
  undefined1 local_208 [8];
  Status s;
  DBImpl *dbi;
  Slice local_1d0;
  WriteOptions local_1b9;
  Status local_1b8;
  Tester local_1b0;
  _Test_CorruptedDescriptor *local_10;
  _Test_CorruptedDescriptor *this_local;
  
  local_10 = this;
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x124);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_1b9.sync = false;
  WriteOptions::WriteOptions(&local_1b9);
  Slice::Slice(&local_1d0,"foo");
  Slice::Slice((Slice *)&dbi,"hello");
  (*pDVar1->_vptr_DB[2])(&local_1b8,pDVar1,&local_1b9,&local_1d0,&dbi);
  test::Tester::IsOk(&local_1b0,&local_1b8);
  Status::~Status(&local_1b8);
  test::Tester::~Tester(&local_1b0);
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)&s);
  Status::~Status(&s);
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kDescriptorFile,0,1000);
  CorruptionTest::TryReopen((CorruptionTest *)local_208);
  test::Tester::Tester
            (&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,299);
  bVar2 = Status::ok((Status *)local_208);
  test::Tester::Is(&local_3a8,(bool)(~bVar2 & 1),"!s.ok()");
  test::Tester::~Tester(&local_3a8);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  std::__cxx11::string::string(local_3c8);
  test::Tester::Tester
            (&local_568,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x130);
  pDVar1 = (this->super_CorruptionTest).db_;
  local_588.verify_checksums = false;
  local_588.fill_cache = false;
  local_588._2_6_ = 0;
  local_588.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_588);
  Slice::Slice(&local_598,"foo");
  (*pDVar1->_vptr_DB[5])(&local_570,pDVar1,&local_588,&local_598,local_3c8);
  test::Tester::IsOk(&local_568,&local_570);
  Status::~Status(&local_570);
  test::Tester::~Tester(&local_568);
  test::Tester::Tester
            (&local_738,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x131);
  test::Tester::IsEq<char[6],std::__cxx11::string>
            (&local_738,(char (*) [6])"hello",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  test::Tester::~Tester(&local_738);
  std::__cxx11::string::~string(local_3c8);
  Status::~Status((Status *)local_208);
  return;
}

Assistant:

TEST(CorruptionTest, CorruptedDescriptor) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "hello"));
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);

  Corrupt(kDescriptorFile, 0, 1000);
  Status s = TryReopen();
  ASSERT_TRUE(!s.ok());

  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("hello", v);
}